

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O2

void toggle(vmd_bst_t *tree,vmd_bst_rev_t *rev,vmd_bst_node_t **affected)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 uVar8;
  size_t sVar9;
  void *pvVar10;
  ulong uVar11;
  long lVar12;
  vmd_bst_node_t *pvVar13;
  size_t sVar14;
  int i;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  
  for (lVar15 = 0; uVar11 = (ulong)rev->erased_count, lVar15 < (long)uVar11; lVar15 = lVar15 + 1) {
    dlist_erase(&tree->free,rev->erased[lVar15]);
    memcpy(&rev->erased[lVar15]->field_0x21,(void *)(tree->csize * lVar15 + (long)rev->erased_data),
           tree->csize);
  }
  for (lVar15 = 0; lVar15 < (int)uVar11; lVar15 = lVar15 + 1) {
    pvVar13 = rev->erased[lVar15];
    if ((pvVar13->field_0x20 & 0x20) == 0) {
      pvVar13->field_0x20 = pvVar13->field_0x20 & 0x5f;
      puVar1 = &rev->erased[lVar15]->field_0x20;
      *puVar1 = *puVar1 | 0x20;
      pvVar13 = rev->erased[lVar15];
      pvVar13->next = *affected;
      *affected = pvVar13;
      pvVar13 = rev->erased[lVar15];
    }
    insert_node(tree,pvVar13);
    uVar11 = (ulong)(uint)rev->erased_count;
  }
  for (lVar15 = 0; lVar15 < rev->inserted_count; lVar15 = lVar15 + 1) {
    pvVar13 = rev->inserted[lVar15];
    if ((pvVar13->field_0x20 & 0x20) == 0) {
      pvVar13->field_0x20 = pvVar13->field_0x20 | 0x80;
      puVar1 = &rev->inserted[lVar15]->field_0x20;
      *puVar1 = *puVar1 | 0x20;
      pvVar13 = rev->inserted[lVar15];
      pvVar13->next = *affected;
      *affected = pvVar13;
      pvVar13 = rev->inserted[lVar15];
    }
    erase_node(tree,pvVar13);
  }
  for (lVar15 = 0; lVar15 < rev->changed_count; lVar15 = lVar15 + 1) {
    erase_node(tree,rev->changed[lVar15]);
    pvVar13 = rev->changed[lVar15];
    sVar9 = tree->csize;
    lVar12 = sVar9 * lVar15;
    pvVar10 = rev->changed_data;
    for (sVar14 = 0; sVar9 != sVar14; sVar14 = sVar14 + 1) {
      uVar8 = *(undefined1 *)((long)pvVar13->child + sVar14 + 0x19);
      *(undefined1 *)((long)pvVar13->child + sVar14 + 0x19) =
           *(undefined1 *)((long)pvVar10 + sVar14 + lVar12);
      *(undefined1 *)((long)pvVar10 + sVar14 + lVar12) = uVar8;
    }
    insert_node(tree,rev->changed[lVar15]);
  }
  uVar2 = rev->inserted_count;
  uVar3 = rev->erased_count;
  rev->inserted_count = uVar3;
  rev->erased_count = uVar2;
  uVar4 = rev->inserted;
  uVar6 = rev->erased;
  uVar5 = rev->uninserted_data;
  uVar7 = rev->erased_data;
  auVar16._8_4_ = (int)uVar4;
  auVar16._0_8_ = uVar6;
  auVar16._12_4_ = (int)((ulong)uVar4 >> 0x20);
  rev->inserted = (vmd_bst_node_t **)uVar6;
  rev->erased = (vmd_bst_node_t **)auVar16._8_8_;
  auVar17._8_4_ = (int)uVar5;
  auVar17._0_8_ = uVar7;
  auVar17._12_4_ = (int)((ulong)uVar5 >> 0x20);
  rev->uninserted_data = (void *)uVar7;
  rev->erased_data = (void *)auVar17._8_8_;
  free_erased(tree,rev);
  return;
}

Assistant:

static void
toggle(bst_t *tree, bst_rev_t *rev, bst_node_t **affected)
{
	unfree_erased(tree, rev);

#ifndef DOXYGEN_IGNORE
#define ADD(node, was) \
	if (!node->inserted) { \
		node->was_in_tree = was; \
		node->inserted = 1; \
		slist_push(affected, node); \
	}
#endif
	int i;
	for (i = 0; i < rev->erased_count; i++) {
		ADD(rev->erased[i], 0);
		insert_node(tree, rev->erased[i]);
	}
	for (i = 0; i < rev->inserted_count; i++) {
		ADD(rev->inserted[i], 1);
		erase_node(tree, rev->inserted[i]);
	}
#undef ADD
	for (i = 0; i < rev->changed_count; i++) {
		//TODO: optimize
		erase_node(tree, rev->changed[i]);
		memswap(rev->changed[i]->data, rev->changed_data + i * tree->csize, tree->csize);
		insert_node(tree, rev->changed[i]);
	}

	SWAP(rev->erased_count, rev->inserted_count, int);
	SWAP(rev->erased, rev->inserted, void *);
	SWAP(rev->erased_data, rev->uninserted_data, void *);

	free_erased(tree, rev);
}